

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl2.h
# Opt level: O2

void nk_glfw3_mouse_button_callback(GLFWwindow *window,int button,int action,int mods)

{
  double dVar1;
  double y;
  double x;
  double local_18;
  double local_10;
  
  if (button != 0) {
    return;
  }
  glfwGetCursorPos(window,&local_10,&local_18);
  if (action == 1) {
    dVar1 = glfwGetTime();
    if ((0.02 < dVar1 - glfw.last_button_click) && (dVar1 - glfw.last_button_click < 0.2)) {
      glfw.is_double_click_down = 1;
      glfw.double_click_pos.x = (float)local_10;
      glfw.double_click_pos.y = (float)local_18;
    }
    glfw.last_button_click = glfwGetTime();
  }
  else {
    glfw.is_double_click_down = 0;
  }
  return;
}

Assistant:

NK_API void
nk_glfw3_mouse_button_callback(GLFWwindow* window, int button, int action, int mods)
{
    double x, y;
    if (button != GLFW_MOUSE_BUTTON_LEFT) return;
    glfwGetCursorPos(window, &x, &y);
    if (action == GLFW_PRESS)  {
        double dt = glfwGetTime() - glfw.last_button_click;
        if (dt > NK_GLFW_DOUBLE_CLICK_LO && dt < NK_GLFW_DOUBLE_CLICK_HI) {
            glfw.is_double_click_down = nk_true;
            glfw.double_click_pos = nk_vec2((float)x, (float)y);
        }
        glfw.last_button_click = glfwGetTime();
    } else glfw.is_double_click_down = nk_false;
}